

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalLibraryBase.cpp
# Opt level: O3

void __thiscall
Js::ExternalLibraryBase::Initialize(ExternalLibraryBase *this,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ExternalLibraryBase *pEVar4;
  Type *addr;
  
  if (this->javascriptLibrary != (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ExternalLibraryBase.cpp"
                                ,0x13,"(this->javascriptLibrary == nullptr)",
                                "this->javascriptLibrary == nullptr");
    if (!bVar2) {
LAB_00b4829c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->javascriptLibrary = library;
  this->scriptContext = (library->super_JavascriptLibraryBase).scriptContext.ptr;
  pEVar4 = (library->externalLibraryList).ptr;
  addr = &library->externalLibraryList;
  if (pEVar4 == (ExternalLibraryBase *)0x0) {
    pEVar4 = (ExternalLibraryBase *)0x0;
  }
  else {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (pEVar4 == this) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ExternalLibraryBase.cpp"
                                    ,0x1a,"(current != this)","current != this");
        if (!bVar2) goto LAB_00b4829c;
        *puVar3 = 0;
      }
      pEVar4 = pEVar4->next;
    } while (pEVar4 != (ExternalLibraryBase *)0x0);
    pEVar4 = addr->ptr;
  }
  this->next = pEVar4;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = this;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void ExternalLibraryBase::Initialize(JavascriptLibrary* library)
    {
        Assert(this->javascriptLibrary == nullptr);
        this->javascriptLibrary = library;
        this->scriptContext = library->GetScriptContext();
#if DBG
        ExternalLibraryBase* current = library->externalLibraryList;
        while (current != nullptr)
        {
            Assert(current != this);
            current = current->next;
        }
#endif
        this->next = library->externalLibraryList;
        library->externalLibraryList = this;
    }